

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::namespace_uri(xpath_node *node)

{
  unspecified_bool_type p_Var1;
  xml_attribute attr;
  xml_node xVar2;
  char_t *local_38;
  xml_attribute local_18;
  xpath_node *local_10;
  xpath_node *node_local;
  
  local_10 = node;
  local_18 = xpath_node::attribute(node);
  p_Var1 = xml_attribute::operator_cast_to_function_pointer(&local_18);
  if (p_Var1 == (unspecified_bool_type)0x0) {
    xVar2 = xpath_node::node(local_10);
    local_38 = namespace_uri(xVar2);
  }
  else {
    attr = xpath_node::attribute(local_10);
    xVar2 = xpath_node::parent(local_10);
    local_38 = namespace_uri(attr,xVar2);
  }
  return local_38;
}

Assistant:

PUGI__FN const char_t* namespace_uri(const xpath_node& node)
	{
		return node.attribute() ? namespace_uri(node.attribute(), node.parent()) : namespace_uri(node.node());
	}